

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_sorted.c
# Opt level: O3

void lyds_unlink(lyd_node **leader,lyd_node *node)

{
  lyd_node *plVar1;
  lyd_meta *meta;
  lyd_meta *root_meta;
  rb_node *rbt;
  lyd_meta *local_30;
  rb_node *local_28;
  rb_node *local_20;
  
  local_28 = (rb_node *)0x0;
  if ((leader != (lyd_node **)0x0 && node != (lyd_node *)0x0) &&
     (plVar1 = *leader, plVar1 != (lyd_node *)0x0)) {
    local_20 = lyds_get_rb_tree(plVar1,&local_30);
    meta = local_30;
    if (((local_30 != (lyd_meta *)0x0) && (plVar1->prev != plVar1)) &&
       ((plVar1->prev->schema == plVar1->schema ||
        ((plVar1->next != (lyd_node *)0x0 && (plVar1->schema == plVar1->next->schema)))))) {
      if (plVar1 == node) {
        plVar1 = plVar1->next;
        lyd_unlink_meta_single(local_30);
        lyd_insert_meta(plVar1,meta,'\0');
      }
      rb_remove_node(local_30,&local_20,node,&local_28);
      free(local_28);
    }
  }
  return;
}

Assistant:

void
lyds_unlink(struct lyd_node **leader, struct lyd_node *node)
{
    struct rb_node *rbt, *removed = NULL;
    struct lyd_meta *root_meta;

    if (!node || !leader || !*leader) {
        return;
    }

    /* get the Red-black tree from the leader */
    rbt = lyds_get_rb_tree(*leader, &root_meta);

    /* find out if leader_p is alone */
    if (!root_meta || LYD_NODE_IS_ALONE(*leader)) {
        return;
    }

    if (*leader == node) {
        /* move the metadata to the next instance. */
        lyds_move_meta((*leader)->next, root_meta);
    }

    rb_remove_node(root_meta, &rbt, node, &removed);
    rb_free_node(&removed);
}